

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O0

bool pybind11::detail::compare_buffer_info<long,_void>::compare(buffer_info *b)

{
  bool bVar1;
  bool local_12;
  bool local_11;
  buffer_info *b_local;
  
  local_11 = false;
  if (b->itemsize == 8) {
    bVar1 = std::operator==(&b->format,"q");
    local_12 = true;
    if (!bVar1) {
      bVar1 = std::operator==(&b->format,"l");
      local_12 = true;
      if (!bVar1) {
        local_12 = std::operator==(&b->format,"n");
      }
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

static bool compare(const buffer_info& b) {
        return (size_t) b.itemsize == sizeof(T) && (b.format == format_descriptor<T>::value ||
            ((sizeof(T) == sizeof(long)) && b.format == (std::is_unsigned<T>::value ? "L" : "l")) ||
            ((sizeof(T) == sizeof(size_t)) && b.format == (std::is_unsigned<T>::value ? "N" : "n")));
    }